

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O0

void __thiscall
AbstractTransaction_GetVsizeFromSize_Test::TestBody(AbstractTransaction_GetVsizeFromSize_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_48;
  Message local_40 [3];
  uint32_t local_28 [2];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  AbstractTransaction_GetVsizeFromSize_Test *this_local;
  
  local_28[1] = 2;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  local_28[0] = cfd::core::AbstractTransaction::GetVsizeFromSize(1,4);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_20,"2","AbstractTransaction::GetVsizeFromSize(1, 4)",
             (int *)(local_28 + 1),local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x150,message);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(AbstractTransaction, GetVsizeFromSize) {
  EXPECT_EQ(2, AbstractTransaction::GetVsizeFromSize(1, 4));
}